

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenTupleMake(BinaryenModuleRef module,BinaryenExpressionRef *operands,BinaryenIndex numOperands
                 )

{
  value_type pEVar1;
  reference ppEVar2;
  TupleMake *pTVar3;
  Builder local_58;
  ulong local_50;
  size_t i;
  undefined1 local_38 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> ops;
  BinaryenIndex numOperands_local;
  BinaryenExpressionRef *operands_local;
  BinaryenModuleRef module_local;
  
  ops.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = numOperands;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_38);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::resize
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_38,
             (ulong)ops.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  for (local_50 = 0;
      local_50 <
      ops.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; local_50 = local_50 + 1) {
    pEVar1 = operands[local_50];
    ppEVar2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_38
                         ,local_50);
    *ppEVar2 = pEVar1;
  }
  wasm::Builder::Builder(&local_58,module);
  pTVar3 = wasm::Builder::
           makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&>
                     (&local_58,
                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_38);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_38);
  return (BinaryenExpressionRef)pTVar3;
}

Assistant:

BinaryenExpressionRef BinaryenTupleMake(BinaryenModuleRef module,
                                        BinaryenExpressionRef* operands,
                                        BinaryenIndex numOperands) {
  std::vector<Expression*> ops;
  ops.resize(numOperands);
  for (size_t i = 0; i < numOperands; ++i) {
    ops[i] = (Expression*)operands[i];
  }
  return static_cast<Expression*>(Builder(*(Module*)module).makeTupleMake(ops));
}